

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubsumptionDemodulationHelper.cpp
# Opt level: O1

ostream * Inferences::operator<<(ostream *o,OverlayBinder *binder)

{
  ostream *poVar1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  value_type binding;
  BindingsMap *__range1;
  string local_90;
  string local_70;
  TermList local_50;
  _Hash_node_base *local_48;
  TermList TStack_40;
  OverlayBinder *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"OverlayBinder { ",0x10);
  p_Var2 = (binder->m_base)._M_h._M_before_begin._M_nxt;
  local_38 = binder;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    bVar3 = true;
    do {
      local_48 = p_Var2[1]._M_nxt;
      TStack_40._content = (uint64_t)p_Var2[2]._M_nxt;
      if (bVar3) {
        bVar3 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
      }
      local_50._content = (uint64_t)((int)local_48 * 4 + 1);
      Kernel::TermList::toString_abi_cxx11_(&local_70,&local_50,false);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (o,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," -> ",4);
      Kernel::TermList::toString_abi_cxx11_(&local_90,&TStack_40,false);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o," / ",3);
  p_Var2 = (local_38->m_overlay)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    bVar3 = true;
    do {
      local_48 = p_Var2[1]._M_nxt;
      TStack_40._content = (uint64_t)p_Var2[2]._M_nxt;
      if (bVar3) {
        bVar3 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
      }
      local_50._content = (uint64_t)((int)local_48 * 4 + 1);
      Kernel::TermList::toString_abi_cxx11_(&local_70,&local_50,false);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (o,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," -> ",4);
      Kernel::TermList::toString_abi_cxx11_(&local_90,&TStack_40,false);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o," }",2);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, OverlayBinder const& binder)
{
  o << "OverlayBinder { ";
  bool first = true;
  for (auto binding : binder.m_base) {
    if (!first) {
      o << ", ";
    } else {
      first = false;
    }
    o << TermList(binding.first, false).toString() << " -> " << binding.second.toString();
  }
  o << " / ";
  first = true;
  for (auto binding : binder.m_overlay) {
    if (!first) {
      o << ", ";
    } else {
      first = false;
    }
    o << TermList(binding.first, false).toString() << " -> " << binding.second.toString();
  }
  o << " }";
  return o;
}